

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta.cc
# Opt level: O2

incoming_edges_range_t *
tchecker::ta::incoming_edges
          (incoming_edges_range_t *__return_storage_ptr__,system_t *system,const_vloc_sptr_t *vloc)

{
  incoming_edges_iterator_t it;
  flat_integer_variables_valuations_range_t fStack_4c8;
  incoming_edges_range_t local_470;
  edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
  local_330;
  
  syncprod::incoming_edges(&local_470,&system->super_system_t,vloc);
  flat_integer_variables_valuations_range
            (&fStack_4c8,
             &(system->super_system_t).super_system_t.super_intvars_t._integer_variables.
              super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._flattened_variables);
  edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
  ::edges_valuations_iterator_t(&local_330,&local_470,&fStack_4c8);
  cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>
  ::~cartesian_iterator_t(&fStack_4c8._begin);
  syncprod::incoming_edges_iterator_t::~incoming_edges_iterator_t(&local_470._begin);
  edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
  ::edges_valuations_iterator_t(&__return_storage_ptr__->_begin,&local_330);
  edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
  ::~edges_valuations_iterator_t(&local_330);
  return __return_storage_ptr__;
}

Assistant:

tchecker::ta::incoming_edges_range_t incoming_edges(tchecker::ta::system_t const & system,
                                                    tchecker::const_vloc_sptr_t const & vloc)
{
  tchecker::ta::incoming_edges_iterator_t it{
      tchecker::syncprod::incoming_edges(system.as_syncprod_system(), vloc),
      tchecker::flat_integer_variables_valuations_range(system.integer_variables().flattened())};
  return tchecker::make_range(it, tchecker::past_the_end_iterator);
}